

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitByBoneCountProcess.cpp
# Opt level: O1

void __thiscall
Assimp::SplitByBoneCountProcess::Execute(SplitByBoneCountProcess *this,aiScene *pScene)

{
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  aiMesh *paVar1;
  Logger *pLVar2;
  aiMesh **__dest;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  aiMesh *srcMesh;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> newMeshes;
  void *local_1f8;
  iterator iStack_1f0;
  aiMesh **local_1e8;
  uint local_1dc;
  aiMesh *local_1d8 [2];
  undefined1 local_1c8 [32];
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> local_1a8 [4];
  ios_base local_138 [264];
  
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"SplitByBoneCountProcess begin");
  if ((ulong)pScene->mNumMeshes == 0) {
    bVar3 = false;
  }
  else {
    uVar4 = 0;
    bVar3 = false;
    do {
      if (this->mMaxBoneCount < (ulong)pScene->mMeshes[uVar4]->mNumBones) {
        bVar3 = true;
      }
      uVar4 = uVar4 + 1;
    } while (pScene->mNumMeshes != uVar4);
  }
  if (bVar3) {
    this_00 = &this->mSubMeshIndices;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::_M_erase_at_end(this_00,(this->mSubMeshIndices).
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::resize(this_00,(ulong)pScene->mNumMeshes);
    local_1f8 = (void *)0x0;
    iStack_1f0._M_current = (aiMesh **)0x0;
    local_1e8 = (aiMesh **)0x0;
    if (pScene->mNumMeshes != 0) {
      uVar4 = 0;
      local_1c8._16_8_ = pScene;
      local_1c8._24_8_ = this;
      do {
        local_1d8[0] = pScene->mMeshes[uVar4];
        local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SplitMesh(this,pScene->mMeshes[uVar4],local_1a8);
        if (local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_1dc = (uint)((ulong)((long)iStack_1f0._M_current - (long)local_1f8) >> 3);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((this_00->
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar4,&local_1dc);
          if (iStack_1f0._M_current == local_1e8) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_1f8,iStack_1f0,local_1d8);
          }
          else {
            *iStack_1f0._M_current = local_1d8[0];
            iStack_1f0._M_current = iStack_1f0._M_current + 1;
          }
        }
        else {
          if (local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar5 = 0;
            uVar6 = 1;
            do {
              local_1dc = (uint)((ulong)((long)iStack_1f0._M_current - (long)local_1f8) >> 3);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        ((this_00->
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar4,&local_1dc);
              if (iStack_1f0._M_current == local_1e8) {
                std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                          ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_1f8,iStack_1f0,
                           (aiMesh **)
                           ((float *)local_1a8[0].
                                     super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                                     .super__Vector_impl_data._M_start + uVar5 * 2));
              }
              else {
                *iStack_1f0._M_current =
                     *(aiMesh **)
                      ((float *)local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar5 * 2);
                iStack_1f0._M_current = iStack_1f0._M_current + 1;
              }
              bVar3 = uVar6 < (ulong)((long)local_1a8[0].
                                            super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_1a8[0].
                                            super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 3);
              uVar5 = uVar6;
              uVar6 = (ulong)((int)uVar6 + 1);
            } while (bVar3);
          }
          this = (SplitByBoneCountProcess *)local_1c8._24_8_;
          pScene = (aiScene *)local_1c8._16_8_;
          paVar1 = local_1d8[0];
          if (local_1d8[0] != (aiMesh *)0x0) {
            aiMesh::~aiMesh(local_1d8[0]);
            operator_delete(paVar1,0x520);
          }
        }
        if ((aiVector3D *)
            local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start != (aiVector3D *)0x0) {
          operator_delete(local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < pScene->mNumMeshes);
    }
    pScene->mNumMeshes = (uint)((ulong)((long)iStack_1f0._M_current - (long)local_1f8) >> 3);
    if (pScene->mMeshes != (aiMesh **)0x0) {
      operator_delete__(pScene->mMeshes);
    }
    __dest = (aiMesh **)operator_new__((ulong)pScene->mNumMeshes << 3);
    pScene->mMeshes = __dest;
    if ((long)iStack_1f0._M_current - (long)local_1f8 != 0) {
      memmove(__dest,local_1f8,(long)iStack_1f0._M_current - (long)local_1f8);
    }
    UpdateNode(this,pScene->mRootNode);
    pLVar2 = DefaultLogger::get();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"SplitByBoneCountProcess end: split ",0x23);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," meshes into ",0xd);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," submeshes.",0xb);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar2,(char *)local_1d8[0]);
    if (local_1d8[0] != (aiMesh *)local_1c8) {
      operator_delete(local_1d8[0],local_1c8._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if (local_1f8 != (void *)0x0) {
      operator_delete(local_1f8,(long)local_1e8 - (long)local_1f8);
    }
  }
  else {
    pLVar2 = DefaultLogger::get();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"SplitByBoneCountProcess early-out: no meshes with more than ",
               0x3c);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," bones.",7);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar2,(char *)local_1d8[0]);
    if (local_1d8[0] != (aiMesh *)local_1c8) {
      operator_delete(local_1d8[0],local_1c8._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void SplitByBoneCountProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("SplitByBoneCountProcess begin");

    // early out
    bool isNecessary = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a)
        if( pScene->mMeshes[a]->mNumBones > mMaxBoneCount )
            isNecessary = true;

    if( !isNecessary )
    {
        ASSIMP_LOG_DEBUG( format() << "SplitByBoneCountProcess early-out: no meshes with more than " << mMaxBoneCount << " bones." );
        return;
    }

    // we need to do something. Let's go.
    mSubMeshIndices.clear();
    mSubMeshIndices.resize( pScene->mNumMeshes);

    // build a new array of meshes for the scene
    std::vector<aiMesh*> meshes;

    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a)
    {
        aiMesh* srcMesh = pScene->mMeshes[a];

        std::vector<aiMesh*> newMeshes;
        SplitMesh( pScene->mMeshes[a], newMeshes);

        // mesh was split
        if( !newMeshes.empty() )
        {
            // store new meshes and indices of the new meshes
            for( unsigned int b = 0; b < newMeshes.size(); ++b)
            {
                mSubMeshIndices[a].push_back( static_cast<unsigned int>(meshes.size()));
                meshes.push_back( newMeshes[b]);
            }

            // and destroy the source mesh. It should be completely contained inside the new submeshes
            delete srcMesh;
        }
        else
        {
            // Mesh is kept unchanged - store it's new place in the mesh array
            mSubMeshIndices[a].push_back( static_cast<unsigned int>(meshes.size()));
            meshes.push_back( srcMesh);
        }
    }

    // rebuild the scene's mesh array
    pScene->mNumMeshes = static_cast<unsigned int>(meshes.size());
    delete [] pScene->mMeshes;
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    std::copy( meshes.begin(), meshes.end(), pScene->mMeshes);

    // recurse through all nodes and translate the node's mesh indices to fit the new mesh array
    UpdateNode( pScene->mRootNode);

    ASSIMP_LOG_DEBUG( format() << "SplitByBoneCountProcess end: split " << mSubMeshIndices.size() << " meshes into " << meshes.size() << " submeshes." );
}